

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O3

void anon_unknown.dwarf_ec09::peekExpectedDelimiter(istream *in)

{
  uint uVar1;
  int iVar2;
  runtime_error *this;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar1 = std::istream::peek();
  iVar2 = isspace((int)(char)(byte)uVar1);
  if ((iVar2 == 0) &&
     ((0x3b < (byte)uVar1 || ((0x800030400000000U >> ((ulong)uVar1 & 0x3f) & 1) == 0)))) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"character not followed by delimiter","");
    std::runtime_error::runtime_error(this,(string *)local_40);
    *(undefined ***)this = &PTR__runtime_error_00113b48;
    __cxa_throw(this,&(anonymous_namespace)::KatException::typeinfo,
                std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void peekExpectedDelimiter(std::istream &in)
    {
        if (!isDelimiter(in.peek())) // FIXME: peek returns int
        {
            throw KatException("character not followed by delimiter");
        }
    }